

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

File * File::parse_file_text(File *__return_storage_ptr__,ifstream *in)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  __type _Var4;
  uint uVar5;
  int iVar6;
  int32_t iVar7;
  long *plVar8;
  size_type sVar9;
  size_type sVar10;
  istream *piVar11;
  ulong uVar12;
  char *pcVar13;
  reference pvVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  reference pvVar16;
  vector<vm::Function,_std::allocator<vm::Function>_> local_c10;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> local_bf8;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_be0;
  allocator<char> local_bc1;
  string local_bc0;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> local_ba0;
  allocator<char> local_b81;
  string local_b80;
  int local_b5c;
  undefined1 local_b58 [4];
  int j;
  exception *anon_var_0_7;
  string local_ae8;
  string local_ac8 [8];
  string temp_2;
  char ch_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a98;
  undefined8 local_a90;
  int local_a84;
  undefined1 local_a80 [4];
  int index_2;
  string local_a60;
  int local_a40;
  allocator<char> local_a39;
  int i;
  int local_a18;
  allocator<char> local_a11;
  int functions_count;
  allocator<char> local_9e9;
  string local_9e8 [3];
  exception *anon_var_0_6;
  allocator<char> local_949;
  string local_948 [3];
  exception *anon_var_0_5;
  allocator<char> local_8a9;
  string local_8a8;
  allocator<char> local_881;
  string local_880;
  allocator<char> local_859;
  string local_858 [2];
  exception *anon_var_0_4;
  allocator<char> local_7e1;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  exception *anon_var_0_3;
  int local_76c;
  string local_768 [4];
  int index_1;
  string temp_1;
  Function function;
  undefined1 local_720 [7];
  bool mainFound;
  vector<vm::Function,_std::allocator<vm::Function>_> functions;
  string local_700;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> local_6e0;
  undefined1 local_6c8 [8];
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> start;
  anon_class_40_5_6335b36b parseInstructions;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630 [2];
  exception *anon_var_0_2;
  double local_5c0;
  allocator<char> local_5b1;
  string local_5b0 [2];
  exception *anon_var_0_1;
  int32_t local_540;
  allocator<char> local_539;
  string local_538;
  allocator<char> local_511;
  string local_510;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  byte local_47a;
  allocator<char> local_479;
  undefined1 local_478 [6];
  char v;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  uchar local_38a;
  allocator<char> local_389;
  undefined1 local_388 [6];
  char ch;
  allocator<char> local_361;
  string local_360;
  exception *anon_var_0;
  int local_314;
  undefined1 local_310 [8];
  string value;
  string type;
  string local_2c8 [4];
  int index;
  string temp;
  Constant constant;
  vector<vm::Constant,_std::allocator<vm::Constant>_> constants;
  anon_class_16_2_9d8d2ce4 ensureNoMoreInput;
  anon_class_8_1_02a47b0a errorInvalidFile;
  anon_class_16_2_ad521349 errorLineInfo;
  anon_class_16_2_51529e6d reuseLine;
  anon_class_32_4_7e715f1c readLine;
  stringstream ss;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string str;
  allocator<char> local_41;
  string local_40 [8];
  string line;
  int line_count;
  ifstream *in_local;
  
  line.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_79);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::stringstream::stringstream((stringstream *)&readLine.ss);
  errorLineInfo.line_count = (int *)local_40;
  errorInvalidFile.errorLineInfo =
       (anon_class_16_2_ad521349 *)((long)&line.field_2._M_allocated_capacity + 0xc);
  constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&readLine.ss;
  ensureNoMoreInput.errorInvalidFile = &errorInvalidFile;
  ensureNoMoreInput.ss = (stringstream *)&ensureNoMoreInput.errorInvalidFile;
  errorLineInfo.line =
       (string *)
       constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  reuseLine.ss = (stringstream *)errorLineInfo.line_count;
  reuseLine.line = (string *)in;
  readLine.in = (ifstream *)errorLineInfo.line_count;
  readLine.line = (string *)errorInvalidFile.errorLineInfo;
  readLine.line_count =
       (int *)constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  parse_file_text::anon_class_32_4_7e715f1c::operator()((anon_class_32_4_7e715f1c *)&reuseLine.line)
  ;
  std::vector<vm::Constant,_std::allocator<vm::Constant>_>::vector
            ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)
             ((long)&constant.value.
                     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
                     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
                     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
                     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double> + 0x20));
  std::operator>>((istream *)&readLine.ss,(string *)local_78);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78,".constants:");
  if (bVar1) {
    parse_file_text::anon_class_16_2_9d8d2ce4::operator()
              ((anon_class_16_2_9d8d2ce4 *)
               &constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    do {
      parse_file_text::anon_class_32_4_7e715f1c::operator()
                ((anon_class_32_4_7e715f1c *)&reuseLine.line);
      vm::Constant::Constant((Constant *)((long)&temp.field_2 + 8));
      std::__cxx11::string::string(local_2c8);
      std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_310);
      piVar11 = std::operator>>((istream *)&readLine.ss,local_2c8);
      bVar3 = std::ios::operator!((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
      if ((bVar3 & 1) == 0) {
        std::__cxx11::string::string((string *)&anon_var_0,local_2c8);
        iVar7 = try_to_int((string *)&anon_var_0);
        std::__cxx11::string::~string((string *)&anon_var_0);
        sVar9 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::size
                          ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)
                           ((long)&constant.value.
                                   super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                   .
                                   super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                   .
                                   super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                   .
                                   super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                   .
                                   super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                           + 0x20));
        if ((long)iVar7 != sVar9) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_360,"unordered index",&local_361);
          parse_file_text::anon_class_8_1_02a47b0a::operator()
                    ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_360);
          std::__cxx11::string::~string((string *)&local_360);
          std::allocator<char>::~allocator(&local_361);
        }
        piVar11 = std::operator>>((istream *)&readLine.ss,(string *)(value.field_2._M_local_buf + 8)
                                 );
        bVar3 = std::ios::operator!((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
        if ((bVar3 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_388,"constant type expected",&local_389);
          parse_file_text::anon_class_8_1_02a47b0a::operator()
                    ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,
                     (string *)local_388);
          std::__cxx11::string::~string((string *)local_388);
          std::allocator<char>::~allocator(&local_389);
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&value.field_2 + 8),"S");
        if (bVar1) {
          temp.field_2._M_local_buf[8] = '\0';
          piVar11 = (istream *)std::istream::operator>>((istream *)&readLine.ss,std::skipws);
          piVar11 = std::operator>>(piVar11,(char *)&local_38a);
          bVar3 = std::ios::operator!((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
          if ((bVar3 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3b0,"string constant expected",&local_3b1);
            parse_file_text::anon_class_8_1_02a47b0a::operator()
                      ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_3b0);
            std::__cxx11::string::~string((string *)&local_3b0);
            std::allocator<char>::~allocator(&local_3b1);
          }
          if (local_38a != '\"') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d8,"no leading qoute for string constant",&local_3d9);
            parse_file_text::anon_class_8_1_02a47b0a::operator()
                      ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_3d8);
            std::__cxx11::string::~string((string *)&local_3d8);
            std::allocator<char>::~allocator(&local_3d9);
          }
          while( true ) {
            plVar8 = (long *)std::istream::get((char *)&readLine.ss);
            bVar3 = std::ios::operator!((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
            if ((bVar3 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_400,"no trailing quote for string constant",&local_401);
              parse_file_text::anon_class_8_1_02a47b0a::operator()
                        ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_400);
              std::__cxx11::string::~string((string *)&local_400);
              std::allocator<char>::~allocator(&local_401);
            }
            if (local_38a == '\"') break;
            if (local_38a == '\\') {
              plVar8 = (long *)std::istream::get((char *)&readLine.ss);
              bVar3 = std::ios::operator!((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
              if ((bVar3 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_428,"incomplete escape seq",&local_429);
                parse_file_text::anon_class_8_1_02a47b0a::operator()
                          ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_428
                          );
                std::__cxx11::string::~string((string *)&local_428);
                std::allocator<char>::~allocator(&local_429);
              }
              if (local_38a == '\"') {
                std::__cxx11::string::operator+=((string *)local_310,'\"');
              }
              else if (local_38a == '\'') {
                std::__cxx11::string::operator+=((string *)local_310,'\'');
              }
              else if (local_38a == '\\') {
                std::__cxx11::string::operator+=((string *)local_310,'\\');
              }
              else if (local_38a == 'n') {
                std::__cxx11::string::operator+=((string *)local_310,'\n');
              }
              else if (local_38a == 'r') {
                std::__cxx11::string::operator+=((string *)local_310,'\r');
              }
              else if (local_38a == 't') {
                std::__cxx11::string::operator+=((string *)local_310,'\t');
              }
              else if (local_38a == 'x') {
                plVar8 = (long *)std::istream::get((char *)&readLine.ss);
                bVar3 = std::ios::operator!((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
                if ((bVar3 & 1) != 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_450,"incomplete hex escape seq",&local_451);
                  parse_file_text::anon_class_8_1_02a47b0a::operator()
                            ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,
                             &local_450);
                  std::__cxx11::string::~string((string *)&local_450);
                  std::allocator<char>::~allocator(&local_451);
                }
                bVar1 = is_hex_digit(local_38a);
                if (!bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_478,"invalid hex escape seq",&local_479);
                  parse_file_text::anon_class_8_1_02a47b0a::operator()
                            ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,
                             (string *)local_478);
                  std::__cxx11::string::~string((string *)local_478);
                  std::allocator<char>::~allocator(&local_479);
                }
                uVar5 = hex_digit_to_int(local_38a);
                local_47a = (byte)((uVar5 & 0xff) << 4);
                plVar8 = (long *)std::istream::get((char *)&readLine.ss);
                bVar3 = std::ios::operator!((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
                if ((bVar3 & 1) != 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_4a0,"incomplete hex escape seq",&local_4a1);
                  parse_file_text::anon_class_8_1_02a47b0a::operator()
                            ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,
                             &local_4a0);
                  std::__cxx11::string::~string((string *)&local_4a0);
                  std::allocator<char>::~allocator(&local_4a1);
                }
                bVar1 = is_hex_digit(local_38a);
                if (!bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_4c8,"invalid hex escape seq",&local_4c9);
                  parse_file_text::anon_class_8_1_02a47b0a::operator()
                            ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,
                             &local_4c8);
                  std::__cxx11::string::~string((string *)&local_4c8);
                  std::allocator<char>::~allocator(&local_4c9);
                }
                iVar6 = hex_digit_to_int(local_38a);
                local_47a = local_47a | (byte)iVar6;
                std::__cxx11::string::operator+=((string *)local_310,local_47a);
              }
              else {
                strfmt<char>(&local_4f0,"unknown escape seq \"\\{}\"",(char *)&local_38a);
                parse_file_text::anon_class_8_1_02a47b0a::operator()
                          ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_4f0
                          );
                std::__cxx11::string::~string((string *)&local_4f0);
              }
            }
            else {
              std::__cxx11::string::operator+=((string *)local_310,local_38a);
            }
          }
          uVar12 = std::__cxx11::string::length();
          if (0xffff < uVar12) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_510,"too long the string constant",&local_511);
            parse_file_text::anon_class_8_1_02a47b0a::operator()
                      ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_510);
            std::__cxx11::string::~string((string *)&local_510);
            std::allocator<char>::~allocator(&local_511);
          }
          std::variant<std::__cxx11::string,int,double>::operator=
                    ((variant<std::__cxx11::string,int,double> *)&constant,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310)
          ;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&value.field_2 + 8),"I");
          if (bVar1) {
            temp.field_2._M_local_buf[8] = '\x01';
            piVar11 = (istream *)std::istream::operator>>((istream *)&readLine.ss,std::skipws);
            piVar11 = std::operator>>(piVar11,(string *)local_310);
            bVar3 = std::ios::operator!((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
            if ((bVar3 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_538,"invalid format",&local_539);
              parse_file_text::anon_class_8_1_02a47b0a::operator()
                        ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_538);
              std::__cxx11::string::~string((string *)&local_538);
              std::allocator<char>::~allocator(&local_539);
            }
            std::__cxx11::string::string((string *)&anon_var_0_1,(string *)local_310);
            local_540 = try_to_int((string *)&anon_var_0_1);
            std::variant<std::__cxx11::string,int,double>::operator=
                      ((variant<std::__cxx11::string,int,double> *)&constant,&local_540);
            std::__cxx11::string::~string((string *)&anon_var_0_1);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&value.field_2 + 8),"D");
            if (bVar1) {
              temp.field_2._M_local_buf[8] = '\x02';
              piVar11 = (istream *)std::istream::operator>>((istream *)&readLine.ss,std::skipws);
              piVar11 = std::operator>>(piVar11,(string *)local_310);
              bVar3 = std::ios::operator!((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
              if ((bVar3 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_5b0,"invalid format",&local_5b1);
                parse_file_text::anon_class_8_1_02a47b0a::operator()
                          ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,local_5b0)
                ;
                std::__cxx11::string::~string((string *)local_5b0);
                std::allocator<char>::~allocator(&local_5b1);
              }
              std::__cxx11::string::string((string *)&anon_var_0_2,(string *)local_310);
              local_5c0 = try_to_double((string *)&anon_var_0_2);
              std::variant<std::__cxx11::string,int,double>::operator=
                        ((variant<std::__cxx11::string,int,double> *)&constant,&local_5c0);
              std::__cxx11::string::~string((string *)&anon_var_0_2);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_630,"invalid constant type",&local_631);
              parse_file_text::anon_class_8_1_02a47b0a::operator()
                        ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,local_630);
              std::__cxx11::string::~string((string *)local_630);
              std::allocator<char>::~allocator(&local_631);
            }
          }
        }
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::push_back
                  ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)
                   ((long)&constant.value.
                           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
                           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
                           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
                           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double> +
                   0x20),(value_type *)((long)&temp.field_2 + 8));
        parse_file_text::anon_class_16_2_9d8d2ce4::operator()
                  ((anon_class_16_2_9d8d2ce4 *)
                   &constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_314 = 0;
      }
      else {
        parse_file_text::anon_class_16_2_51529e6d::operator()
                  ((anon_class_16_2_51529e6d *)&errorLineInfo.line);
        local_314 = 3;
      }
      std::__cxx11::string::~string((string *)local_310);
      std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      std::__cxx11::string::~string(local_2c8);
      vm::Constant::~Constant((Constant *)((long)&temp.field_2 + 8));
    } while (local_314 == 0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_658,".constants expected",&local_659);
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_658);
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator(&local_659);
  }
  sVar9 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::size
                    ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)
                     ((long)&constant.value.
                             super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                             .
                             super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                             .
                             super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                             .super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
                             super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double> +
                     0x20));
  if (0xffff < sVar9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_680,"too many constants",
               (allocator<char> *)((long)&parseInstructions.ensureNoMoreInput + 7));
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_680);
    std::__cxx11::string::~string((string *)&local_680);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&parseInstructions.ensureNoMoreInput + 7));
  }
  start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&reuseLine.line;
  parseInstructions.ss = (stringstream *)&errorLineInfo.line;
  parseInstructions.reuseLine = (anon_class_16_2_51529e6d *)&ensureNoMoreInput.errorInvalidFile;
  parseInstructions.errorInvalidFile =
       (anon_class_8_1_02a47b0a *)
       &constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  parseInstructions.readLine = (anon_class_32_4_7e715f1c *)&readLine.ss;
  std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::vector
            ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_6c8);
  std::operator>>((istream *)&readLine.ss,(string *)local_78);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78,".start:");
  if (bVar1) {
    parse_file_text::anon_class_16_2_9d8d2ce4::operator()
              ((anon_class_16_2_9d8d2ce4 *)
               &constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    parse_file_text::anon_class_40_5_6335b36b::operator()
              (&local_6e0,
               (anon_class_40_5_6335b36b *)
               &start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::operator=
              ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_6c8,&local_6e0);
    std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::~vector(&local_6e0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_700,".start expected",
               (allocator<char> *)
               ((long)&functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_700);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::vector<vm::Function,_std::allocator<vm::Function>_>::vector
            ((vector<vm::Function,_std::allocator<vm::Function>_> *)local_720);
  bVar1 = false;
  std::operator>>((istream *)&readLine.ss,(string *)local_78);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78,".functions:");
  if (bVar2) {
    parse_file_text::anon_class_16_2_9d8d2ce4::operator()
              ((anon_class_16_2_9d8d2ce4 *)
               &constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    do {
      parse_file_text::anon_class_32_4_7e715f1c::operator()
                ((anon_class_32_4_7e715f1c *)&reuseLine.line);
      vm::Function::Function((Function *)((long)&temp_1.field_2 + 8));
      std::__cxx11::string::string(local_768);
      piVar11 = std::operator>>((istream *)&readLine.ss,local_768);
      bVar3 = std::ios::operator!((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
      if ((bVar3 & 1) == 0) {
        std::__cxx11::string::string((string *)&anon_var_0_3,local_768);
        local_76c = try_to_int((string *)&anon_var_0_3);
        std::__cxx11::string::~string((string *)&anon_var_0_3);
        sVar9 = (size_type)local_76c;
        sVar10 = std::vector<vm::Function,_std::allocator<vm::Function>_>::size
                           ((vector<vm::Function,_std::allocator<vm::Function>_> *)local_720);
        if (sVar9 != sVar10) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7b8,"unordered index",&local_7b9);
          parse_file_text::anon_class_8_1_02a47b0a::operator()
                    ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_7b8);
          std::__cxx11::string::~string((string *)&local_7b8);
          std::allocator<char>::~allocator(&local_7b9);
        }
        piVar11 = std::operator>>((istream *)&readLine.ss,local_768);
        bVar3 = std::ios::operator!((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
        if ((bVar3 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7e0,"name_index expected",&local_7e1);
          parse_file_text::anon_class_8_1_02a47b0a::operator()
                    ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_7e0);
          std::__cxx11::string::~string((string *)&local_7e0);
          std::allocator<char>::~allocator(&local_7e1);
        }
        std::__cxx11::string::string((string *)&anon_var_0_4,local_768);
        iVar7 = try_to_int((string *)&anon_var_0_4);
        temp_1.field_2._8_2_ = (undefined2)iVar7;
        std::__cxx11::string::~string((string *)&anon_var_0_4);
        uVar12 = (ulong)(ushort)temp_1.field_2._8_2_;
        sVar9 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::size
                          ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)
                           ((long)&constant.value.
                                   super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                   .
                                   super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                   .
                                   super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                   .
                                   super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                   .
                                   super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                           + 0x20));
        if (sVar9 <= uVar12) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_858,"name not found",&local_859);
          parse_file_text::anon_class_8_1_02a47b0a::operator()
                    ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,local_858);
          std::__cxx11::string::~string((string *)local_858);
          std::allocator<char>::~allocator(&local_859);
        }
        pvVar14 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::operator[]
                            ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)
                             ((long)&constant.value.
                                     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                     .
                                     super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                             + 0x20),(ulong)(ushort)temp_1.field_2._8_2_);
        if (pvVar14->type != STRING) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_880,"name not found",&local_881);
          parse_file_text::anon_class_8_1_02a47b0a::operator()
                    ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_880);
          std::__cxx11::string::~string((string *)&local_880);
          std::allocator<char>::~allocator(&local_881);
        }
        pvVar14 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::operator[]
                            ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)
                             ((long)&constant.value.
                                     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                     .
                                     super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                             + 0x20),(ulong)(ushort)temp_1.field_2._8_2_);
        pbVar15 = std::get<std::__cxx11::string,std::__cxx11::string,int,double>(&pvVar14->value);
        bVar2 = std::operator==(pbVar15,"main");
        if (bVar2) {
          bVar1 = true;
        }
        piVar11 = std::operator>>((istream *)&readLine.ss,local_768);
        bVar3 = std::ios::operator!((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
        if ((bVar3 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8a8,"param_size expected",&local_8a9);
          parse_file_text::anon_class_8_1_02a47b0a::operator()
                    ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_8a8);
          std::__cxx11::string::~string((string *)&local_8a8);
          std::allocator<char>::~allocator(&local_8a9);
        }
        std::__cxx11::string::string((string *)&anon_var_0_5,local_768);
        iVar7 = try_to_int((string *)&anon_var_0_5);
        temp_1.field_2._10_2_ = (undefined2)iVar7;
        std::__cxx11::string::~string((string *)&anon_var_0_5);
        piVar11 = std::operator>>((istream *)&readLine.ss,local_768);
        bVar3 = std::ios::operator!((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
        if ((bVar3 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_948,"level expected",&local_949);
          parse_file_text::anon_class_8_1_02a47b0a::operator()
                    ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,local_948);
          std::__cxx11::string::~string((string *)local_948);
          std::allocator<char>::~allocator(&local_949);
        }
        std::__cxx11::string::string((string *)&anon_var_0_6,local_768);
        iVar7 = try_to_int((string *)&anon_var_0_6);
        temp_1.field_2._12_2_ = (undefined2)iVar7;
        std::__cxx11::string::~string((string *)&anon_var_0_6);
        std::vector<vm::Function,_std::allocator<vm::Function>_>::push_back
                  ((vector<vm::Function,_std::allocator<vm::Function>_> *)local_720,
                   (value_type *)((long)&temp_1.field_2 + 8));
        parse_file_text::anon_class_16_2_9d8d2ce4::operator()
                  ((anon_class_16_2_9d8d2ce4 *)
                   &constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_314 = 0;
      }
      else {
        parse_file_text::anon_class_16_2_51529e6d::operator()
                  ((anon_class_16_2_51529e6d *)&errorLineInfo.line);
        local_314 = 0x34;
      }
      std::__cxx11::string::~string(local_768);
      vm::Function::~Function((Function *)((long)&temp_1.field_2 + 8));
    } while (local_314 == 0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_9e8,".functions expected",&local_9e9);
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,local_9e8);
    std::__cxx11::string::~string((string *)local_9e8);
    std::allocator<char>::~allocator(&local_9e9);
  }
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&functions_count,"main() not found",&local_a11);
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,
               (string *)&functions_count);
    std::__cxx11::string::~string((string *)&functions_count);
    std::allocator<char>::~allocator(&local_a11);
  }
  sVar9 = std::vector<vm::Function,_std::allocator<vm::Function>_>::size
                    ((vector<vm::Function,_std::allocator<vm::Function>_> *)local_720);
  local_a18 = (int)sVar9;
  if (0xffff < local_a18) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&i,"too many functions",&local_a39)
    ;
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator(&local_a39);
  }
  local_a40 = 0;
  do {
    if (local_a18 <= local_a40) {
      piVar11 = std::operator>>((istream *)in,(string *)local_78);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_bc0,"unused content",&local_bc1);
        parse_file_text::anon_class_8_1_02a47b0a::operator()
                  ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_bc0);
        std::__cxx11::string::~string((string *)&local_bc0);
        std::allocator<char>::~allocator(&local_bc1);
      }
      std::vector<vm::Constant,_std::allocator<vm::Constant>_>::vector
                (&local_be0,
                 (vector<vm::Constant,_std::allocator<vm::Constant>_> *)
                 ((long)&constant.value.
                         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
                         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
                         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
                         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double> +
                 0x20));
      std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::vector
                (&local_bf8,(vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_6c8);
      std::vector<vm::Function,_std::allocator<vm::Function>_>::vector
                (&local_c10,(vector<vm::Function,_std::allocator<vm::Function>_> *)local_720);
      File(__return_storage_ptr__,1,&local_be0,&local_bf8,&local_c10);
      std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_c10);
      std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::~vector(&local_bf8);
      std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_be0);
      local_314 = 1;
      std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector
                ((vector<vm::Function,_std::allocator<vm::Function>_> *)local_720);
      std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::~vector
                ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_6c8);
      std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector
                ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)
                 ((long)&constant.value.
                         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
                         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
                         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
                         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double> +
                 0x20));
      std::__cxx11::stringstream::~stringstream((stringstream *)&readLine.ss);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string(local_40);
      return __return_storage_ptr__;
    }
    piVar11 = std::operator>>((istream *)&readLine.ss,(string *)local_78);
    bVar3 = std::ios::operator!((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
    if ((bVar3 & 1) != 0) {
      strfmt<int>(&local_a60,"\".F{}:\" expected",&local_a40);
      parse_file_text::anon_class_8_1_02a47b0a::operator()
                ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_a60);
      std::__cxx11::string::~string((string *)&local_a60);
    }
    uVar12 = std::__cxx11::string::length();
    if ((uVar12 < 2) || (pcVar13 = (char *)std::__cxx11::string::back(), *pcVar13 != ':')) {
      strfmt<int>((string *)local_a80,"\".F{}:\" expected",&local_a40);
      parse_file_text::anon_class_8_1_02a47b0a::operator()
                ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,(string *)local_a80)
      ;
      std::__cxx11::string::~string((string *)local_a80);
    }
    std::__cxx11::string::pop_back();
    local_a84 = -1;
    pcVar13 = (char *)std::__cxx11::string::front();
    if (*pcVar13 == '.') {
      local_a98._M_current = (char *)std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_a90,&local_a98);
      std::__cxx11::string::erase(local_78,local_a90);
      std::__cxx11::stringstream::str((string *)&readLine.ss);
      std::ios::clear((long)&readLine.ss + *(long *)(readLine.ss + -0x18),0);
      piVar11 = (istream *)std::istream::operator>>((istream *)&readLine.ss,std::skipws);
      std::operator>>(piVar11,temp_2.field_2._M_local_buf + 0xf);
      if ((temp_2.field_2._M_local_buf[0xf] == 'F') || (temp_2.field_2._M_local_buf[0xf] == 'f')) {
        std::__cxx11::string::string(local_ac8);
        piVar11 = std::operator>>((istream *)&readLine.ss,local_ac8);
        bVar3 = std::ios::operator!((ios *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18)));
        if ((bVar3 & 1) != 0) {
          strfmt<int>(&local_ae8,"\".F{}:\" expected",&local_a40);
          parse_file_text::anon_class_8_1_02a47b0a::operator()
                    ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_ae8);
          std::__cxx11::string::~string((string *)&local_ae8);
        }
        std::__cxx11::string::string((string *)&anon_var_0_7,local_ac8);
        local_a84 = try_to_int((string *)&anon_var_0_7);
        std::__cxx11::string::~string((string *)&anon_var_0_7);
        if (local_a84 != local_a40) {
          strfmt<int>((string *)local_b58,"\".F{}:\" expected",&local_a40);
          parse_file_text::anon_class_8_1_02a47b0a::operator()
                    ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,
                     (string *)local_b58);
          std::__cxx11::string::~string((string *)local_b58);
        }
        std::__cxx11::string::~string(local_ac8);
      }
    }
    else {
      local_a84 = -1;
      for (local_b5c = 0; local_b5c < local_a18; local_b5c = local_b5c + 1) {
        pvVar16 = std::vector<vm::Function,_std::allocator<vm::Function>_>::at
                            ((vector<vm::Function,_std::allocator<vm::Function>_> *)local_720,
                             (long)local_b5c);
        pvVar14 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::at
                            ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)
                             ((long)&constant.value.
                                     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                     .
                                     super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                             + 0x20),(ulong)pvVar16->nameIndex);
        pbVar15 = std::get<std::__cxx11::string,std::__cxx11::string,int,double>(&pvVar14->value);
        _Var4 = std::operator==(pbVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_78);
        if (_Var4) {
          local_a84 = local_b5c;
          break;
        }
      }
    }
    parse_file_text::anon_class_16_2_9d8d2ce4::operator()
              ((anon_class_16_2_9d8d2ce4 *)
               &constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_a84 < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b80,"no such function",&local_b81);
      parse_file_text::anon_class_8_1_02a47b0a::operator()
                ((anon_class_8_1_02a47b0a *)&ensureNoMoreInput.errorInvalidFile,&local_b80);
      std::__cxx11::string::~string((string *)&local_b80);
      std::allocator<char>::~allocator(&local_b81);
    }
    parse_file_text::anon_class_40_5_6335b36b::operator()
              (&local_ba0,
               (anon_class_40_5_6335b36b *)
               &start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pvVar16 = std::vector<vm::Function,_std::allocator<vm::Function>_>::at
                        ((vector<vm::Function,_std::allocator<vm::Function>_> *)local_720,
                         (long)local_a84);
    std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::operator=
              (&pvVar16->instructions,&local_ba0);
    std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::~vector(&local_ba0);
    local_a40 = local_a40 + 1;
  } while( true );
}

Assistant:

File File::parse_file_text(std::ifstream& in) {
    int line_count = 0;
    std::string line = "";
    std::string str = "";
    std::stringstream ss;
    const auto readLine = [&]() {
        while(std::getline(in, line)) {
            ++line_count;
            // remove comment
            if (auto ed = line.find_first_of('#'); ed != std::string::npos) {
                line.resize(ed); 
                // line.erase(line.begin()+ed, line.end());
            }
            // remove leading and trailing whitespaces
            line = trim(std::move(line));
            // not a blank line     
            if (!line.empty()) {
                ss.str(line);
                ss.clear();
                return;
            }
        }
        // eof
        line = "";
        ss.str("");
        ss.clear();
    };
    const auto reuseLine = [&]() {
        ss.str(line);
        ss.clear();
    };
    const auto errorLineInfo = [&]() {
        println(std::cerr, "line", line_count, ":\n   ", line);
    };
    const auto errorInvalidFile = [&](std::string msg) {
        errorLineInfo();
        throw InvalidFile(msg);
    };
    #define errorIf(cond, msg)    do { if ((cond)) { errorInvalidFile((msg)); } } while(false)
    #define errorIfNot(cond, msg) errorIf(!(cond), (msg))
    #define errorIfAssignFailed(lhs, rhs, msg) do { try { lhs = (rhs); } catch (const std::exception&) { errorIf(true, (msg)); } } while(false)
    auto ensureNoMoreInput = [&]() {
        if (char ch; ss >> std::skipws >> ch) {
            errorIf(true, "invalid line");
        }
    };

    readLine();

    // parse constants
    std::vector<vm::Constant> constants;
    ss >> str;
    if (str == ".constants:") {
        ensureNoMoreInput();
        while (true) {
            // {index} {type} {value}
            readLine();
            vm::Constant constant;
            std::string temp;
            int index;
            std::string type;
            std::string value;
            // eof
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != constants.size(), "unordered index");
            errorIfNot(ss >> type, "constant type expected");
            if (type == "S") {
                constant.type = vm::Constant::Type::STRING;
                char ch;
                errorIfNot(ss >> std::skipws >> ch, "string constant expected");
                errorIf(ch != '\"', "no leading qoute for string constant");
                // parse the content of string
                while (true) {
                    errorIfNot(ss.get(ch), "no trailing quote for string constant");
                    if (ch == '\"') { 
                        break; 
                    }
                    if (ch == '\\') {
                        errorIfNot(ss.get(ch), "incomplete escape seq");
                        switch (ch) {
                        case '\\': value += '\\'; break;
                        case '\'': value += '\''; break;
                        case '\"': value += '\"'; break;
                        case 'n':  value += '\n'; break;
                        case 'r':  value += '\r'; break;
                        case 't':  value += '\t'; break;
                        case 'x': {
                            errorIfNot(ss.get(ch), "incomplete hex escape seq");
                            errorIfNot(is_hex_digit(ch), "invalid hex escape seq");
                            char v = (0xff & hex_digit_to_int(ch)) << 4;
                            errorIfNot(ss.get(ch), "incomplete hex escape seq");
                            errorIfNot(is_hex_digit(ch), "invalid hex escape seq");
                            v |= (0xff & hex_digit_to_int(ch));
                            value += v;
                        }; break;
                        default: errorIf(true, strfmt("unknown escape seq \"\\{}\"", ch));
                        }
                    }
                    else {
                        value += ch;
                    }
                }
                errorIf(value.length() > UINT16_MAX, "too long the string constant");
                constant.value = std::move(value);
            }
            else if (type == "I") {
                constant.type = vm::Constant::Type::INT;
                errorIfNot(ss >> std::skipws >> value, "invalid format");
                errorIfAssignFailed(constant.value, try_to_int(value), "out of range or invalid format");
            }
            else if (type == "D") {
                constant.type = vm::Constant::Type::DOUBLE;
                errorIfNot(ss >> std::skipws >> value, "invalid format");
                errorIfAssignFailed(constant.value, try_to_double(value), "out of range or invalid format");
            }
            else {
                errorIf(true, "invalid constant type");
            }
            constants.push_back(std::move(constant));
            ensureNoMoreInput();
        }
    }
    else {
        errorIf(true, ".constants expected");
    }
    errorIf(constants.size() > U2_MAX, "too many constants");

    // parse instructions
    auto parseInstructions = [&]() {
        std::vector<vm::Instruction> rtv;
        while(true) {
            // {index} {opcode} {param1} {param2}
            readLine();
            std::string temp;
            int index;
            std::string opName;
            // eof
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != rtv.size(), "unordered index");
            errorIfNot(ss >> opName, "opcode expected");
            opName = to_lower(opName);
            vm::Instruction ins;
            if (auto it = vm::opCodeOfName.find(opName); true) {
                errorIf(it == vm::opCodeOfName.end(), "no such opcode");
                ins.op = it->second;
            }
            if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
                int paramCount = it->second.size();
                std::string restLine;
                errorIfNot(std::getline(ss, restLine), "parameters expected");
                auto params = split(restLine, ',');
                errorIf(params.size() != paramCount, 
                    strfmt("{} parameters expected, {} got", paramCount, params.size())
                );
                errorIfAssignFailed(ins.x, try_to_int(params[0]), 
                    strfmt("invalid first parameter: {}", params[0])
                );
                if (paramCount == 2) {
                    errorIfAssignFailed(ins.y, try_to_int(params[1]), 
                        strfmt("invalid second parameter: {}", params[1])
                    );
                }
            }
            ensureNoMoreInput();
            rtv.push_back(ins);
        }
        errorIf(rtv.size() > U2_MAX, "too many instructions");
        return rtv;
    };

    // parse start
    std::vector<vm::Instruction> start;
    ss >> str;
    if (str == ".start:") {
        ensureNoMoreInput();
        start = std::move(parseInstructions());
    }
    else {
        errorIf(true, ".start expected");
    }

    // parse functions
    std::vector<vm::Function> functions;
    bool mainFound = false;
    ss >> str;
    if (str == ".functions:") {
        ensureNoMoreInput();
        while (true) {
            // {index} {nameIndex} {paramSize} {level}
            readLine();
            vm::Function function;
            std::string temp;
            int index;
            // no more function
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != functions.size(), "unordered index");
            errorIfNot(ss >> temp, "name_index expected");
            errorIfAssignFailed(function.nameIndex, try_to_int(temp), "invalid name_index");
            errorIf(function.nameIndex >= constants.size(), "name not found");
            errorIf(constants[function.nameIndex].type != vm::Constant::Type::STRING, "name not found");
            if (std::get<vm::str_t>(constants[function.nameIndex].value) == "main") {
                mainFound = true;
            }
            errorIfNot(ss >> temp, "param_size expected");
            errorIfAssignFailed(function.paramSize, try_to_int(temp), "invalid param_size");
            errorIf(function.paramSize > U2_MAX, "too many parameters");
            errorIfNot(ss >> temp, "level expected");
            errorIfAssignFailed(function.level, try_to_int(temp), "invalid level");
            errorIf(function.level > U2_MAX, "too high the level");
            functions.push_back(std::move(function));
            ensureNoMoreInput();
        }
    }
    else {
        errorIf(true, ".functions expected");
    }
    errorIfNot(mainFound, "main() not found");

    int functions_count = functions.size();
    errorIf(functions_count > U2_MAX, "too many functions");
    for (int i = 0; i < functions_count; ++i) {
        errorIfNot(ss >> str, strfmt("\".F{}:\" expected", i));
        errorIf((str.length() < 2 || str.back() != ':'), strfmt("\".F{}:\" expected", i));
        str.pop_back();

        int index = -1;
        if (str.front() == '.') {
            str.erase(str.begin());
            ss.str(str);
            ss.clear();
            char ch;
            ss >> std::skipws >> ch;
            if ((ch == 'F' || ch == 'f')) {
                // .Fx
                std::string temp;
                errorIfNot(ss >> temp, strfmt("\".F{}:\" expected", i));
                errorIfAssignFailed(index, try_to_int(temp), "invalid function index");
                errorIf(index != i, strfmt("\".F{}:\" expected", i));
            }
        }
        else {
            // str is name
            index = -1;
            for (auto j = 0; j < functions_count; ++j) {
                if (std::get<std::string>(constants.at(functions.at(j).nameIndex).value) == str) {
                    index = j;
                    break;
                }
            } 
        }
        ensureNoMoreInput();
        errorIf(index < 0, "no such function");
        functions.at(index).instructions = std::move(parseInstructions());
    }

    errorIf(in >> str, "unused content");

    return File{0x00000001, std::move(constants), std::move(start), std::move(functions)};
}